

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O2

uint32_t unicode_get_short_code(uint32_t c)

{
  if (0x7f < c) {
    if (0xcf < c) {
      return (uint32_t)unicode_get_short_code::unicode_short_table[c - 0xd0];
    }
    c = c + 0x280;
  }
  return c;
}

Assistant:

static uint32_t unicode_get_short_code(uint32_t c)
{
    static const uint16_t unicode_short_table[2] = { 0x2044, 0x2215 };

    if (c < 0x80)
        return c;
    else if (c < 0x80 + 0x50)
        return c - 0x80 + 0x300;
    else
        return unicode_short_table[c - 0x80 - 0x50];
}